

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void fts5RowidFunction(sqlite3_context *pCtx,int nArg,sqlite3_value **apVal)

{
  byte bVar1;
  void *pvVar2;
  i64 iVar3;
  i64 iVar4;
  long lVar5;
  char *z;
  Mem *pMVar6;
  
  if (nArg == 0) {
    pCtx->isError = 1;
    pMVar6 = pCtx->pOut;
    z = "should be: fts5_rowid(subject, ....)";
  }
  else {
    pvVar2 = sqlite3ValueText(*apVal,'\x01');
    if (pvVar2 != (void *)0x0) {
      lVar5 = 0;
      do {
        bVar1 = *(byte *)((long)pvVar2 + lVar5);
        if (bVar1 == "segment"[lVar5]) {
          if ((ulong)bVar1 == 0) goto LAB_001d5295;
        }
        else if (""[bVar1] != ""[(byte)"segment"[lVar5]]) break;
        lVar5 = lVar5 + 1;
      } while( true );
    }
    pCtx->isError = 1;
    pMVar6 = pCtx->pOut;
    z = "first arg to fts5_rowid() must be \'segment\'";
  }
LAB_001d52e2:
  sqlite3VdbeMemSetStr(pMVar6,z,-1,'\x01',(_func_void_void_ptr *)0xffffffffffffffff);
  return;
LAB_001d5295:
  if (nArg == 3) {
    iVar3 = sqlite3VdbeIntValue(apVal[1]);
    iVar4 = sqlite3VdbeIntValue(apVal[2]);
    lVar5 = (long)(int)iVar4 + (iVar3 << 0x25);
    pMVar6 = pCtx->pOut;
    if ((pMVar6->flags & 0x2400) != 0) {
      vdbeReleaseAndSetInt64(pMVar6,lVar5);
      return;
    }
    (pMVar6->u).i = lVar5;
    pMVar6->flags = 4;
    return;
  }
  pCtx->isError = 1;
  pMVar6 = pCtx->pOut;
  z = "should be: fts5_rowid(\'segment\', segid, pgno))";
  goto LAB_001d52e2;
}

Assistant:

static void fts5RowidFunction(
  sqlite3_context *pCtx,          /* Function call context */
  int nArg,                       /* Number of args (always 2) */
  sqlite3_value **apVal           /* Function arguments */
){
  const char *zArg;
  if( nArg==0 ){
    sqlite3_result_error(pCtx, "should be: fts5_rowid(subject, ....)", -1);
  }else{
    zArg = (const char*)sqlite3_value_text(apVal[0]);
    if( 0==sqlite3_stricmp(zArg, "segment") ){
      i64 iRowid;
      int segid, pgno;
      if( nArg!=3 ){
        sqlite3_result_error(pCtx, 
            "should be: fts5_rowid('segment', segid, pgno))", -1
        );
      }else{
        segid = sqlite3_value_int(apVal[1]);
        pgno = sqlite3_value_int(apVal[2]);
        iRowid = FTS5_SEGMENT_ROWID(segid, pgno);
        sqlite3_result_int64(pCtx, iRowid);
      }
    }else{
      sqlite3_result_error(pCtx, 
        "first arg to fts5_rowid() must be 'segment'" , -1
      );
    }
  }
}